

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O2

void tcg_gen_and_vec_aarch64
               (TCGContext_conflict1 *tcg_ctx,uint vece,TCGv_vec r,TCGv_vec a,TCGv_vec b)

{
  TCGv_vec in_R9;
  
  vec_gen_op3(tcg_ctx,INDEX_op_and_vec,(uint)r,a,b,in_R9);
  return;
}

Assistant:

void tcg_gen_and_vec(TCGContext *tcg_ctx, unsigned vece, TCGv_vec r, TCGv_vec a, TCGv_vec b)
{
    vec_gen_op3(tcg_ctx, INDEX_op_and_vec, 0, r, a, b);
}